

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_rowcol3(int a,int b)

{
  void *pvVar1;
  size_t _size_9;
  size_t _size_8;
  size_t _size_7;
  size_t _size_6;
  size_t _size_5;
  size_t _size_4;
  size_t _size_3;
  size_t _size_2;
  size_t _size_1;
  size_t _size;
  parasail_result_t *result;
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_rowcol3");
    _b_local = (parasail_result_t *)0x0;
  }
  else {
    _b_local = parasail_result_new();
    if (_b_local == (parasail_result_t *)0x0) {
      _b_local = (parasail_result_t *)0x0;
    }
    else {
      pvVar1 = malloc(0x18);
      (_b_local->field_4).extra = pvVar1;
      if ((_b_local->field_4).extra == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",0x18);
        _b_local = (parasail_result_t *)0x0;
      }
      else {
        pvVar1 = malloc(0x40);
        ((_b_local->field_4).trace)->trace_del_table = pvVar1;
        if (((_b_local->field_4).trace)->trace_del_table == (void *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",0x40);
          _b_local = (parasail_result_t *)0x0;
        }
        else {
          pvVar1 = malloc((long)b << 2);
          *(void **)((_b_local->field_4).trace)->trace_del_table = pvVar1;
          if (*((_b_local->field_4).trace)->trace_del_table == 0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",
                    (long)b << 2);
            _b_local = (parasail_result_t *)0x0;
          }
          else {
            pvVar1 = malloc((long)b << 2);
            *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 8) = pvVar1;
            if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 8) == 0) {
              fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",
                      (long)b << 2);
              _b_local = (parasail_result_t *)0x0;
            }
            else {
              pvVar1 = malloc((long)b << 2);
              *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x10) = pvVar1;
              if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x10) == 0) {
                fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",
                        (long)b << 2);
                _b_local = (parasail_result_t *)0x0;
              }
              else {
                pvVar1 = malloc((long)b << 2);
                *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x18) = pvVar1;
                if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x18) == 0) {
                  fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",
                          (long)b << 2);
                  _b_local = (parasail_result_t *)0x0;
                }
                else {
                  pvVar1 = malloc((long)a << 2);
                  *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x20) = pvVar1;
                  if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x20) == 0) {
                    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3"
                            ,(long)a << 2);
                    _b_local = (parasail_result_t *)0x0;
                  }
                  else {
                    pvVar1 = malloc((long)a << 2);
                    *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x28) = pvVar1;
                    if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x28) == 0) {
                      fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                              "parasail_result_new_rowcol3",(long)a << 2);
                      _b_local = (parasail_result_t *)0x0;
                    }
                    else {
                      pvVar1 = malloc((long)a << 2);
                      *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x30) = pvVar1
                      ;
                      if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x30) == 0)
                      {
                        fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                                "parasail_result_new_rowcol3",(long)a << 2);
                        _b_local = (parasail_result_t *)0x0;
                      }
                      else {
                        pvVar1 = malloc((long)a << 2);
                        *(void **)((long)((_b_local->field_4).trace)->trace_del_table + 0x38) =
                             pvVar1;
                        if (*(long *)((long)((_b_local->field_4).trace)->trace_del_table + 0x38) ==
                            0) {
                          fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                                  "parasail_result_new_rowcol3",(long)a << 2);
                          _b_local = (parasail_result_t *)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _b_local;
}

Assistant:

parasail_result_t* parasail_result_new_rowcol3(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;
    
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);
    PARASAIL_NEW(result->stats->rowcols, parasail_result_extra_stats_rowcols_t);
    PARASAIL_CALLOC(result->stats->rowcols->score_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->matches_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->similar_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->length_row, int, b);

    PARASAIL_CALLOC(result->stats->rowcols->score_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->matches_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->similar_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->length_col, int, a);

    return result;
}